

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O3

bool anon_unknown.dwarf_136b449::HandleLockCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  cmMakefile *pcVar1;
  pointer pcVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  string *in_base;
  Status SVar6;
  FILE *__stream;
  cmGlobalGenerator *pcVar7;
  bool bVar8;
  pointer pbVar9;
  uint uVar10;
  ulong uVar11;
  _Alloc_hider timeoutSec;
  cmFileLockPool *this;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_03;
  string_view value;
  cmFileLockResult fileLockResult;
  string parentDir;
  string path;
  long scanned;
  string resultVariable;
  string result;
  int local_12c;
  cmFileLockResult local_118;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  undefined8 local_68;
  size_type local_60;
  char *local_58;
  undefined8 local_50;
  undefined8 local_48;
  char *local_40;
  undefined8 local_38;
  
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  pbVar9 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar9) < 0x21) {
    pcVar1 = status->Makefile;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"sub-command LOCK requires at least two arguments.","");
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    bVar4 = false;
    goto LAB_003c9173;
  }
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  pcVar2 = pbVar9[1]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f0,pcVar2,pcVar2 + pbVar9[1]._M_string_length);
  pbVar9 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar9) < 0x41) {
    timeoutSec._M_p = (pointer)0xffffffffffffffff;
    local_12c = 2;
    bVar4 = false;
  }
  else {
    timeoutSec._M_p = (pointer)0xffffffffffffffff;
    local_12c = 2;
    bVar8 = false;
    bVar4 = false;
    uVar11 = 2;
    do {
      uVar10 = (uint)uVar11;
      iVar5 = std::__cxx11::string::compare((char *)(pbVar9 + uVar11));
      if (iVar5 == 0) {
        bVar8 = true;
      }
      else {
        iVar5 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar11));
        if (iVar5 != 0) {
          iVar5 = std::__cxx11::string::compare
                            ((char *)((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar11));
          if (iVar5 == 0) {
            uVar10 = uVar10 + 1;
            uVar11 = (ulong)uVar10;
            pbVar9 = (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            if (uVar11 < (ulong)((long)(args->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar9 >>
                                5)) {
              iVar5 = std::__cxx11::string::compare((char *)(pbVar9 + uVar11));
              if (iVar5 == 0) {
                local_12c = 0;
              }
              else {
                iVar5 = std::__cxx11::string::compare
                                  ((char *)((args->
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start + uVar11));
                if (iVar5 == 0) {
                  local_12c = 1;
                }
                else {
                  iVar5 = std::__cxx11::string::compare
                                    ((char *)((args->
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              )._M_impl.super__Vector_impl_data._M_start + uVar11));
                  local_12c = 2;
                  if (iVar5 != 0) {
                    pcVar1 = status->Makefile;
                    pbVar9 = (args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start;
                    local_90._M_dataplus._M_p = (pointer)0x2e;
                    local_90._M_string_length = 0x8b4525;
                    local_90.field_2._M_allocated_capacity = 0;
                    local_90.field_2._8_8_ = 0xe;
                    local_70 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                *)0x8b4554;
                    local_68 = 0;
                    local_58 = pbVar9[uVar11]._M_dataplus._M_p;
                    local_60 = pbVar9[uVar11]._M_string_length;
                    local_50 = 0;
                    local_48 = 2;
                    local_40 = "\".";
                    local_38 = 0;
                    views_03._M_len = 4;
                    views_03._M_array = (iterator)&local_90;
                    cmCatViews(&local_110,views_03);
                    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_110);
                    goto LAB_003c913f;
                  }
                }
              }
              goto LAB_003c8a97;
            }
            pcVar1 = status->Makefile;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_90,"expected FUNCTION, FILE or PROCESS after GUARD",
                       (allocator<char> *)&local_110);
            cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_90);
            local_110.field_2._M_allocated_capacity = local_90.field_2._M_allocated_capacity;
            local_110._M_dataplus._M_p = local_90._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._M_dataplus._M_p != &local_90.field_2) goto LAB_003c9152;
          }
          else {
            iVar5 = std::__cxx11::string::compare
                              ((char *)((args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + uVar11));
            if (iVar5 == 0) {
              uVar10 = uVar10 + 1;
              if ((ulong)uVar10 <
                  (ulong)((long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start >> 5)) {
                std::__cxx11::string::_M_assign((string *)&local_b0);
                goto LAB_003c8a97;
              }
              pcVar1 = status->Makefile;
              local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_90,"expected variable name after RESULT_VARIABLE","");
              cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_90);
LAB_003c9085:
              local_110.field_2._M_allocated_capacity = local_90.field_2._M_allocated_capacity;
              local_110._M_dataplus._M_p = local_90._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_90._M_dataplus._M_p != &local_90.field_2) goto LAB_003c9152;
            }
            else {
              iVar5 = std::__cxx11::string::compare
                                ((char *)((args->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start + uVar11));
              if (iVar5 == 0) {
                uVar10 = uVar10 + 1;
                uVar11 = (ulong)uVar10;
                pbVar9 = (args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                if ((ulong)((long)(args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar9 >> 5)
                    <= uVar11) {
                  pcVar1 = status->Makefile;
                  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_90,"expected timeout value after TIMEOUT","");
                  cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_90);
                  goto LAB_003c9085;
                }
                bVar3 = cmStrToLong(pbVar9 + uVar11,(long *)&local_d0);
                timeoutSec._M_p = local_d0._M_dataplus._M_p;
                if (bVar3 && -1 < (long)local_d0._M_dataplus._M_p) goto LAB_003c8a97;
                pcVar1 = status->Makefile;
                pbVar9 = (args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                local_90._M_dataplus._M_p = (pointer)0xf;
                local_90._M_string_length = 0x8b45b5;
                local_90.field_2._M_allocated_capacity = 0;
                local_70 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)pbVar9[uVar11]._M_dataplus._M_p;
                local_90.field_2._8_8_ = pbVar9[uVar11]._M_string_length;
                local_68 = 0;
                local_60 = 0x1d;
                local_58 = "\" is not an unsigned integer.";
                local_50 = 0;
                views_02._M_len = 3;
                views_02._M_array = (iterator)&local_90;
                cmCatViews(&local_110,views_02);
                cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_110);
              }
              else {
                pcVar1 = status->Makefile;
                pbVar9 = (args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                local_90._M_dataplus._M_p = (pointer)0x37;
                local_90._M_string_length = 0x8b45c5;
                local_90.field_2._M_allocated_capacity = 0;
                local_90.field_2._8_8_ = 0x12;
                local_70 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)0x8b45fd;
                local_68 = 0;
                local_58 = pbVar9[uVar11]._M_dataplus._M_p;
                local_60 = pbVar9[uVar11]._M_string_length;
                local_50 = 0;
                local_48 = 2;
                local_40 = "\".";
                local_38 = 0;
                views_01._M_len = 4;
                views_01._M_array = (iterator)&local_90;
                cmCatViews(&local_110,views_01);
                cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_110);
              }
LAB_003c913f:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_110._M_dataplus._M_p != &local_110.field_2) {
LAB_003c9152:
                operator_delete(local_110._M_dataplus._M_p,
                                local_110.field_2._M_allocated_capacity + 1);
              }
            }
          }
          bVar4 = false;
          goto LAB_003c915c;
        }
        bVar4 = true;
      }
LAB_003c8a97:
      uVar11 = (ulong)(uVar10 + 1);
      pbVar9 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar11 < (ulong)((long)(args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar9 >> 5)
            );
    if (bVar8) {
      std::__cxx11::string::append((char *)&local_f0);
    }
  }
  in_base = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(status->Makefile);
  cmsys::SystemTools::CollapseFullPath(&local_90,&local_f0,in_base);
  std::__cxx11::string::operator=((string *)&local_f0,(string *)&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  cmsys::SystemTools::GetParentDirectory(&local_110,&local_f0);
  SVar6 = cmsys::SystemTools::MakeDirectory(&local_110,(mode_t *)0x0);
  if (SVar6.Kind_ == Success) {
    __stream = (FILE *)cmsys::SystemTools::Fopen(&local_f0,"w");
    if (__stream == (FILE *)0x0) {
      pcVar1 = status->Makefile;
      local_90._M_dataplus._M_p = (pointer)0x8;
      local_90._M_string_length = 0x8b465f;
      local_90.field_2._M_allocated_capacity = 0;
      local_90.field_2._8_8_ = local_f0._M_string_length;
      local_70 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_f0._M_dataplus._M_p;
      local_68 = 0;
      local_60 = 0x26;
      local_58 = "\"\ncreation failed (check permissions).";
      local_50 = 0;
      views_00._M_len = 3;
      views_00._M_array = (iterator)&local_90;
      cmCatViews(&local_d0,views_00);
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_d0);
      goto LAB_003c8bf7;
    }
    fclose(__stream);
    pcVar7 = cmMakefile::GetGlobalGenerator(status->Makefile);
    local_118 = cmFileLockResult::MakeOk();
    this = &pcVar7->FileLockPool;
    if (bVar4) {
      local_118 = cmFileLockPool::Release(this,&local_f0);
    }
    else if (local_12c == 2) {
      local_118 = cmFileLockPool::LockProcessScope(this,&local_f0,(unsigned_long)timeoutSec._M_p);
    }
    else if (local_12c == 1) {
      local_118 = cmFileLockPool::LockFileScope(this,&local_f0,(unsigned_long)timeoutSec._M_p);
    }
    else {
      local_118 = cmFileLockPool::LockFunctionScope(this,&local_f0,(unsigned_long)timeoutSec._M_p);
    }
    cmFileLockResult::GetOutputMessage_abi_cxx11_(&local_90,&local_118);
    if (local_b0._M_string_length == 0) {
      bVar4 = cmFileLockResult::IsOk(&local_118);
      if (bVar4) {
        if (local_b0._M_string_length != 0) goto LAB_003c8f5a;
        bVar4 = true;
      }
      else {
        pcVar1 = status->Makefile;
        cmStrCat<char_const(&)[23],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string_const&,char_const(&)[2]>
                  (&local_d0,(char (*) [23])"error locking file\n  \"",&local_f0,
                   (char (*) [3])0x8d10c3,&local_90,(char (*) [2])0x891b59);
        cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        cmSystemTools::s_FatalErrorOccurred = true;
        bVar4 = false;
      }
    }
    else {
LAB_003c8f5a:
      bVar4 = true;
      value._M_str = local_90._M_dataplus._M_p;
      value._M_len = local_90._M_string_length;
      cmMakefile::AddDefinition(status->Makefile,&local_b0,value);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    pcVar1 = status->Makefile;
    local_90._M_dataplus._M_p = (pointer)0xd;
    local_90._M_string_length = 0x8b461c;
    local_90.field_2._M_allocated_capacity = 0;
    local_90.field_2._8_8_ = local_110._M_string_length;
    local_70 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_110._M_dataplus._M_p;
    local_68 = 0;
    local_60 = 0x26;
    local_58 = "\"\ncreation failed (check permissions).";
    local_50 = 0;
    views._M_len = 3;
    views._M_array = (iterator)&local_90;
    cmCatViews(&local_d0,views);
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_d0);
LAB_003c8bf7:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    cmSystemTools::s_FatalErrorOccurred = true;
    bVar4 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
LAB_003c915c:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
LAB_003c9173:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,
                    CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                             local_b0.field_2._M_local_buf[0]) + 1);
  }
  return bVar4;
}

Assistant:

bool HandleLockCommand(std::vector<std::string> const& args,
                       cmExecutionStatus& status)
{
#if !defined(CMAKE_BOOTSTRAP)
  // Default values
  bool directory = false;
  bool release = false;
  enum Guard
  {
    GUARD_FUNCTION,
    GUARD_FILE,
    GUARD_PROCESS
  };
  Guard guard = GUARD_PROCESS;
  std::string resultVariable;
  unsigned long timeout = static_cast<unsigned long>(-1);

  // Parse arguments
  if (args.size() < 2) {
    status.GetMakefile().IssueMessage(
      MessageType::FATAL_ERROR,
      "sub-command LOCK requires at least two arguments.");
    return false;
  }

  std::string path = args[1];
  for (unsigned i = 2; i < args.size(); ++i) {
    if (args[i] == "DIRECTORY") {
      directory = true;
    } else if (args[i] == "RELEASE") {
      release = true;
    } else if (args[i] == "GUARD") {
      ++i;
      const char* merr = "expected FUNCTION, FILE or PROCESS after GUARD";
      if (i >= args.size()) {
        status.GetMakefile().IssueMessage(MessageType::FATAL_ERROR, merr);
        return false;
      }
      if (args[i] == "FUNCTION") {
        guard = GUARD_FUNCTION;
      } else if (args[i] == "FILE") {
        guard = GUARD_FILE;
      } else if (args[i] == "PROCESS") {
        guard = GUARD_PROCESS;
      } else {
        status.GetMakefile().IssueMessage(
          MessageType::FATAL_ERROR,
          cmStrCat(merr, ", but got:\n  \"", args[i], "\"."));
        return false;
      }

    } else if (args[i] == "RESULT_VARIABLE") {
      ++i;
      if (i >= args.size()) {
        status.GetMakefile().IssueMessage(
          MessageType::FATAL_ERROR,
          "expected variable name after RESULT_VARIABLE");
        return false;
      }
      resultVariable = args[i];
    } else if (args[i] == "TIMEOUT") {
      ++i;
      if (i >= args.size()) {
        status.GetMakefile().IssueMessage(
          MessageType::FATAL_ERROR, "expected timeout value after TIMEOUT");
        return false;
      }
      long scanned;
      if (!cmStrToLong(args[i], &scanned) || scanned < 0) {
        status.GetMakefile().IssueMessage(
          MessageType::FATAL_ERROR,
          cmStrCat("TIMEOUT value \"", args[i],
                   "\" is not an unsigned integer."));
        return false;
      }
      timeout = static_cast<unsigned long>(scanned);
    } else {
      status.GetMakefile().IssueMessage(
        MessageType::FATAL_ERROR,
        cmStrCat("expected DIRECTORY, RELEASE, GUARD, RESULT_VARIABLE or ",
                 "TIMEOUT\nbut got: \"", args[i], "\"."));
      return false;
    }
  }

  if (directory) {
    path += "/cmake.lock";
  }

  // Unify path (remove '//', '/../', ...)
  path = cmSystemTools::CollapseFullPath(
    path, status.GetMakefile().GetCurrentSourceDirectory());

  // Create file and directories if needed
  std::string parentDir = cmSystemTools::GetParentDirectory(path);
  if (!cmSystemTools::MakeDirectory(parentDir)) {
    status.GetMakefile().IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("directory\n  \"", parentDir,
               "\"\ncreation failed (check permissions)."));
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }
  FILE* file = cmsys::SystemTools::Fopen(path, "w");
  if (!file) {
    status.GetMakefile().IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("file\n  \"", path,
               "\"\ncreation failed (check permissions)."));
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }
  fclose(file);

  // Actual lock/unlock
  cmFileLockPool& lockPool =
    status.GetMakefile().GetGlobalGenerator()->GetFileLockPool();

  cmFileLockResult fileLockResult(cmFileLockResult::MakeOk());
  if (release) {
    fileLockResult = lockPool.Release(path);
  } else {
    switch (guard) {
      case GUARD_FUNCTION:
        fileLockResult = lockPool.LockFunctionScope(path, timeout);
        break;
      case GUARD_FILE:
        fileLockResult = lockPool.LockFileScope(path, timeout);
        break;
      case GUARD_PROCESS:
        fileLockResult = lockPool.LockProcessScope(path, timeout);
        break;
      default:
        cmSystemTools::SetFatalErrorOccurred();
        return false;
    }
  }

  const std::string result = fileLockResult.GetOutputMessage();

  if (resultVariable.empty() && !fileLockResult.IsOk()) {
    status.GetMakefile().IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("error locking file\n  \"", path, "\"\n", result, "."));
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  if (!resultVariable.empty()) {
    status.GetMakefile().AddDefinition(resultVariable, result);
  }

  return true;
#else
  static_cast<void>(args);
  status.SetError("sub-command LOCK not implemented in bootstrap cmake");
  return false;
#endif
}